

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall liblogger::LogFile::Log(LogFile *this,LogType Type,string *str)

{
  FILE *__stream;
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  string *psVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  LogException *pLVar9;
  string local_290;
  time_t current;
  stringstream ss;
  ostream local_258 [376];
  tm timeinfo;
  char buf [128];
  
  if (this->m_fp != (FILE *)0x0) {
    current = time((time_t *)0x0);
    localtime_r(&current,(tm *)&timeinfo);
    sVar4 = strftime(buf,0x80,"%F %T",(tm *)&timeinfo);
    if (sVar4 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_258,"strftime failed: \'");
      poVar6 = std::operator<<(poVar6,"\' error: ");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(poVar6,pcVar8);
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,&local_290);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
    __stream = (FILE *)this->m_fp;
    psVar5 = LogTypeToStr_abi_cxx11_(Type);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    uVar2 = getpid();
    iVar3 = fprintf(__stream,"%s - %s [PID: %d] - %s\n",buf,pcVar1,(ulong)uVar2,
                    (str->_M_dataplus)._M_p);
    if (iVar3 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_258,"failed to write to file \'");
      poVar6 = std::operator<<(poVar6,(this->m_fname)._M_dataplus._M_p);
      poVar6 = std::operator<<(poVar6,"\' error:");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(poVar6,pcVar8);
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,&local_290);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
    iVar3 = fflush((FILE *)this->m_fp);
    if (iVar3 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_258,"failed to fflush to file \'");
      poVar6 = std::operator<<(poVar6,(this->m_fname)._M_dataplus._M_p);
      poVar6 = std::operator<<(poVar6,"\' error:");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(poVar6,pcVar8);
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,&local_290);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
  }
  return;
}

Assistant:

void LogFile::Log(const LogType Type, const std::string &str)
{
	if (m_fp == NULL)
		return;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to file '" << m_fname.c_str() << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to fflush to file '" << m_fname.c_str() << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}